

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O0

void __thiscall QAccessibleWidget::doAction(QAccessibleWidget *this,QString *actionName)

{
  bool bVar1;
  QWidget *in_RSI;
  QString *in_stack_ffffffffffffffd8;
  
  widget((QAccessibleWidget *)0x7de591);
  bVar1 = QWidget::isEnabled((QWidget *)0x7de599);
  if (bVar1) {
    QAccessibleActionInterface::setFocusAction();
    bVar1 = ::operator==((QString *)in_RSI,in_stack_ffffffffffffffd8);
    if (bVar1) {
      widget((QAccessibleWidget *)0x7de5cb);
      bVar1 = QWidget::isWindow(in_RSI);
      if (bVar1) {
        widget((QAccessibleWidget *)0x7de5e3);
        QWidget::activateWindow(in_RSI);
      }
      widget((QAccessibleWidget *)0x7de5f5);
      QWidget::setFocus((QWidget *)0x7de5fd);
    }
  }
  return;
}

Assistant:

void QAccessibleWidget::doAction(const QString &actionName)
{
    if (!widget()->isEnabled())
        return;

    if (actionName == setFocusAction()) {
        if (widget()->isWindow())
            widget()->activateWindow();
        widget()->setFocus();
    }
}